

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O2

void __thiscall QEvdevKeyboardManager::loadKeymap(QEvdevKeyboardManager *this,QString *file)

{
  pointer pDVar1;
  QEvdevKeyboardHandler *this_00;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  Device *keyboard;
  pointer pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  long lVar8;
  Device *keyboard_1;
  QStringView *arg;
  QStringView *this_01;
  long in_FS_OFFSET;
  QLatin1StringView s;
  char16_t *local_b8;
  long local_b0;
  QStringView local_a0;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QStringView> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(&this->m_defaultKeymapFile,file);
  if ((file->d).size == 0) {
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d._0_4_ = 0xaaaaaaaa;
    local_78.d._4_4_ = 0xaaaaaaaa;
    local_78.ptr._0_4_ = 0xaaaaaaaa;
    local_78.ptr._4_4_ = 0xaaaaaaaa;
    local_90.ptr = (this->m_spec).d.ptr;
    local_90.d = (Data *)(this->m_spec).d.size;
    local_b0 = 0;
    QStringView::split(&local_78,&local_90,0x3a,0,1);
    this_01 = (QStringView *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
    local_b8 = (char16_t *)0x0;
    pDVar6 = (Data *)0x0;
    for (lVar8 = local_78.size << 4; lVar8 != 0; lVar8 = lVar8 + -0x10) {
      s.m_data = "keymap=";
      s.m_size = 7;
      bVar4 = QStringView::startsWith(this_01,s,CaseSensitive);
      pDVar7 = pDVar6;
      if (bVar4) {
        local_a0 = QStringView::mid(this_01,7,-1);
        QStringView::toString((QString *)&local_90,&local_a0);
        qVar3 = local_90.size;
        pcVar2 = local_90.ptr;
        pDVar7 = local_90.d;
        local_58.d = local_90.d;
        local_58.ptr = local_90.ptr;
        local_90.ptr = local_b8;
        local_58.size = local_90.size;
        local_90.size = local_b0;
        local_90.d = pDVar6;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        local_b0 = qVar3;
        local_b8 = pcVar2;
      }
      this_01 = this_01 + 1;
      pDVar6 = pDVar7;
    }
    pDVar1 = (this->m_keyboards).v.
             super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar5 = (this->m_keyboards).v.
                  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
                  ._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar1; pDVar5 = pDVar5 + 1)
    {
      this_00 = (pDVar5->handler)._M_t.
                super___uniq_ptr_impl<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>
                ._M_t.
                super__Tuple_impl<0UL,_QEvdevKeyboardHandler_*,_std::default_delete<QEvdevKeyboardHandler>_>
                .super__Head_base<0UL,_QEvdevKeyboardHandler_*,_false>._M_head_impl;
      if (local_58.size == 0) {
        QEvdevKeyboardHandler::unloadKeymap(this_00);
      }
      else {
        QEvdevKeyboardHandler::loadKeymap(this_00,(QString *)&local_58);
      }
    }
    QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  else {
    pDVar1 = (this->m_keyboards).v.
             super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar5 = (this->m_keyboards).v.
                  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
                  ._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar1; pDVar5 = pDVar5 + 1)
    {
      QEvdevKeyboardHandler::loadKeymap
                ((pDVar5->handler)._M_t.
                 super___uniq_ptr_impl<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QEvdevKeyboardHandler_*,_std::default_delete<QEvdevKeyboardHandler>_>
                 .super__Head_base<0UL,_QEvdevKeyboardHandler_*,_false>._M_head_impl,file);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevKeyboardManager::loadKeymap(const QString &file)
{
    m_defaultKeymapFile = file;

    if (file.isEmpty()) {
        // Restore the default, which is either the built-in keymap or
        // the one given in the plugin spec.
        QString keymapFromSpec;
        const auto specs = QStringView{m_spec}.split(u':');
        for (const auto &arg : specs) {
            if (arg.startsWith("keymap="_L1))
                keymapFromSpec = arg.mid(7).toString();
        }
        for (const auto &keyboard : m_keyboards) {
            if (keymapFromSpec.isEmpty())
                keyboard.handler->unloadKeymap();
            else
                keyboard.handler->loadKeymap(keymapFromSpec);
        }
    } else {
        for (const auto &keyboard : m_keyboards)
            keyboard.handler->loadKeymap(file);
    }
}